

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharMap.h
# Opt level: O3

void __thiscall
UnifiedRegex::CharMap<char16_t,_unsigned_long,_(UnifiedRegex::CharMapScheme)1>::Inner::Set
          (Inner *this,ArenaAllocator *allocator,unsigned_long defv,int level,uint k,unsigned_long v
          )

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Node *pNVar4;
  undefined **ppuVar5;
  long lVar6;
  uint uVar7;
  undefined1 auVar8 [16];
  
  if (level < 1) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharMap.h"
                       ,0xb6,"(level > 0)","level > 0");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  uVar7 = k >> ((byte)(level << 2) & 0x1f) & 0xf;
  pNVar4 = this->children[uVar7];
  if (pNVar4 == (Node *)0x0) {
    if (v == defv) {
      return;
    }
    pNVar4 = (Node *)new<Memory::ArenaAllocator>(0x88,allocator,0x364470);
    if (level - 1U == 0) {
      ppuVar5 = &PTR_FreeSelf_015435e8;
      pNVar4->_vptr_Node = (_func_int **)&PTR_FreeSelf_015435e8;
      auVar8._8_4_ = (int)defv;
      auVar8._0_8_ = defv;
      auVar8._12_4_ = (int)(defv >> 0x20);
      lVar6 = 0;
      do {
        *(undefined1 (*) [16])(pNVar4 + 1 + lVar6) = auVar8;
        lVar6 = lVar6 + 2;
      } while (lVar6 != 0x10);
    }
    else {
      ppuVar5 = &PTR_FreeSelf_015435a8;
      pNVar4->_vptr_Node = (_func_int **)&PTR_FreeSelf_015435a8;
      *(undefined1 (*) [16])(pNVar4 + 0xf) = (undefined1  [16])0x0;
      *(undefined1 (*) [16])(pNVar4 + 0xd) = (undefined1  [16])0x0;
      *(undefined1 (*) [16])(pNVar4 + 0xb) = (undefined1  [16])0x0;
      *(undefined1 (*) [16])(pNVar4 + 9) = (undefined1  [16])0x0;
      *(undefined1 (*) [16])(pNVar4 + 7) = (undefined1  [16])0x0;
      *(undefined1 (*) [16])(pNVar4 + 5) = (undefined1  [16])0x0;
      *(undefined1 (*) [16])(pNVar4 + 3) = (undefined1  [16])0x0;
      *(undefined1 (*) [16])(pNVar4 + 1) = (undefined1  [16])0x0;
    }
    this->children[uVar7] = pNVar4;
  }
  else {
    ppuVar5 = pNVar4->_vptr_Node;
  }
  (*((_func_int **)ppuVar5)[1])(pNVar4,allocator,defv,(ulong)(level - 1U),(ulong)k,v);
  return;
}

Assistant:

void Set(ArenaAllocator* allocator, V defv, int level, uint k, V v) override
            {
                Assert(level > 0);
                uint i = innerIdx(level--, k);
                if (children[i] == 0)
                {
                    if (v == defv)
                        return;
                    children[i] = Node::For(allocator, level, defv);
                }
                children[i]->Set(allocator, defv, level, k, v);
            }